

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int average(int argc,char **argv)

{
  undefined4 uVar1;
  char *__s;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  memory_resource *pmVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  Point2i p;
  Image *im;
  pointer this;
  Float FVar10;
  atomic<bool> failed;
  string filenameBase;
  string avgFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> avgImages;
  Image avgImage;
  byte local_329;
  char *local_328;
  char **local_320;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  Image *local_2c0;
  long local_2b8;
  ulong local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  vector<pbrt::Image,_std::allocator<pbrt::Image>_> local_288;
  _Any_data local_270;
  undefined1 local_260 [152];
  size_t sStack_1c8;
  uintptr_t local_1c0;
  undefined1 local_1b8 [16];
  size_t sStack_1a8;
  size_t local_1a0;
  undefined1 local_198 [16];
  size_t sStack_188;
  size_t local_180;
  undefined1 local_178 [16];
  size_t sStack_168;
  size_t local_160;
  undefined8 *local_158;
  undefined8 uStack_150;
  code *pcStack_148;
  code *pcStack_140;
  ImageMetadata local_138;
  
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  local_328 = "must provide base filename.";
  local_320 = argv;
  if (*argv != (char *)0x0) {
    do {
      local_270._M_unused._M_object = local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"outfile","");
      local_2a8._M_unused._M_object = (void *)0x0;
      local_2a8._8_8_ = 0;
      local_290 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:574:24)>
                  ::_M_invoke;
      local_298 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:574:24)>
                  ::_M_manager;
      bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                        (&local_320,(string *)&local_270,&local_2f8,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_2a8);
      if (local_298 != (code *)0x0) {
        (*local_298)(&local_2a8,&local_2a8,__destroy_functor);
      }
      if ((undefined1 *)local_270._M_unused._0_8_ != local_260) {
        operator_delete(local_270._M_unused._M_object,
                        (ulong)((long)(_func_int ***)local_260._0_8_ + 1));
      }
      if (!bVar3) {
        __s = *local_320;
        if ((local_318._M_string_length != 0) || (*__s == '-')) {
          usage("average","%s: unknown argument",__s);
        }
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_318,0,(char *)0x0,(ulong)__s);
        local_320 = local_320 + 1;
      }
    } while (*local_320 != (char *)0x0);
    if (local_318._M_string_length != 0) {
      if (local_2f8._M_string_length != 0) {
        pbrt::MatchingFilenames(&local_2d8,&local_318);
        if (local_2d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_2d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          average();
          iVar4 = 1;
        }
        else {
          iVar4 = pbrt::MaxThreadIndex();
          std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::vector
                    (&local_288,(long)iVar4,(allocator_type *)local_270._M_pod_data);
          local_329 = 0;
          local_158 = (undefined8 *)0x0;
          uStack_150 = 0;
          pcStack_148 = (code *)0x0;
          pcStack_140 = (code *)0x0;
          local_158 = (undefined8 *)operator_new(0x18);
          local_270._M_unused._M_object = &local_158;
          *local_158 = &local_2d8;
          local_158[1] = &local_288;
          local_158[2] = &local_329;
          pcStack_140 = std::
                        _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:603:38)>
                        ::_M_invoke;
          pcStack_148 = std::
                        _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:603:38)>
                        ::_M_manager;
          local_270._8_4_ = 0;
          local_270._12_4_ = 0;
          local_260._8_8_ =
               std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
               ::_M_invoke;
          local_260._0_8_ =
               std::
               _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
               ::_M_manager;
          pbrt::ParallelFor(0,(long)local_2d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5,
                            (function<void_(long,_long)> *)&local_270);
          if ((memory_resource *)local_260._0_8_ != (memory_resource *)0x0) {
            (*(code *)local_260._0_8_)(&local_270,&local_270,3);
          }
          if (pcStack_148 != (code *)0x0) {
            (*pcStack_148)(&local_158,&local_158,3);
          }
          iVar4 = 1;
          if ((local_329 & 1) == 0) {
            pmVar5 = pstd::pmr::new_delete_resource();
            local_270._0_4_ = 0;
            local_270._4_4_ = 0;
            local_270._8_4_ = 0;
            local_260._0_8_ = pstd::pmr::new_delete_resource();
            register0x00001200 = ZEXT816(0) << 0x40;
            local_260._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_1c0 = 0;
            local_1a0 = 0;
            local_180 = 0;
            local_160 = 0;
            local_2c0 = local_288.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            local_1b8._0_8_ = pmVar5;
            unique0x10000aa2 = register0x00001200;
            local_198._0_8_ = pmVar5;
            unique0x10000ad2 = register0x00001200;
            local_178._0_8_ = pmVar5;
            unique0x10000b02 = register0x00001200;
            if (local_288.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_288.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              this = local_288.super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl
                     .super__Vector_impl_data._M_start;
              do {
                if ((this->resolution).super_Tuple2<pbrt::Point2,_int> !=
                    (Tuple2<pbrt::Point2,_int>)0x0) {
                  lVar6 = CONCAT44(local_270._8_4_,local_270._4_4_);
                  if (lVar6 == 0) {
                    local_270._8_4_ = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
                    uVar1 = this->format;
                    uVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
                    local_270._0_4_ = uVar1;
                    local_270._4_4_ = uVar2;
                    pbrt::
                    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_260,&this->channelNames);
                    local_1c0 = (this->encoding).
                                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                                .bits;
                    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                    operator=((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>
                               *)local_1b8,&this->p8);
                    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::
                    operator=((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                              local_198,&this->p16);
                    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_178,
                               &this->p32);
                  }
                  else if (0 < (int)local_270._8_4_) {
                    lVar8 = 0;
                    do {
                      local_2b8 = lVar8;
                      if (0 < (int)lVar6) {
                        local_2b0 = lVar8 << 0x20;
                        uVar9 = 0;
                        sVar7 = sStack_1c8;
                        do {
                          if (0 < (int)sVar7) {
                            iVar4 = 0;
                            p.super_Tuple2<pbrt::Point2,_int> =
                                 (Tuple2<pbrt::Point2,_int>)(local_2b0 | uVar9);
                            do {
                              FVar10 = pbrt::Image::GetChannel(this,p,iVar4,(WrapMode2D)0x200000002)
                              ;
                              local_328 = (char *)CONCAT44(local_328._4_4_,FVar10);
                              if (ABS(FVar10) != INFINITY) {
                                FVar10 = pbrt::Image::GetChannel
                                                   ((Image *)&local_270,p,iVar4,
                                                    (WrapMode2D)0x200000002);
                                pbrt::Image::SetChannel
                                          ((Image *)&local_270,p,iVar4,FVar10 + local_328._0_4_);
                              }
                              iVar4 = iVar4 + 1;
                            } while (iVar4 < local_260._152_4_);
                            lVar6 = CONCAT44(local_270._8_4_,local_270._4_4_);
                            sVar7 = sStack_1c8;
                          }
                          uVar9 = uVar9 + 1;
                        } while ((long)uVar9 < (long)(int)lVar6);
                      }
                      lVar8 = local_2b8 + 1;
                    } while (lVar8 < lVar6 >> 0x20);
                  }
                }
                this = this + 1;
              } while (this != local_2c0);
            }
            local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
            local_138.colorSpace.optionalValue =
                 (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                  )0x0;
            local_138.colorSpace.set = false;
            local_138.colorSpace._9_7_ = 0;
            local_138.stringVectors._M_t._M_impl._0_8_ = 0;
            local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_138.NDCFromWorld.optionalValue._52_8_ = 0;
            local_138.NDCFromWorld._60_8_ = 0;
            local_138.pixelBounds.optionalValue._0_8_ = 0;
            local_138.pixelBounds.optionalValue._8_8_ = 0;
            local_138._160_8_ = 0;
            local_138.fullResolution._4_8_ = 0;
            local_138.samplesPerPixel.optionalValue =
                 (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
            local_138.samplesPerPixel.set = false;
            local_138.samplesPerPixel._5_3_ = 0;
            local_138.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
            local_138.MSE.set = false;
            local_138.MSE._5_3_ = 0;
            local_138.cameraFromWorld.optionalValue._56_8_ = 0;
            local_138._72_8_ = 0;
            local_138.NDCFromWorld.optionalValue._4_8_ = 0;
            local_138.NDCFromWorld.optionalValue._12_8_ = 0;
            local_138.NDCFromWorld.optionalValue._20_8_ = 0;
            local_138.NDCFromWorld.optionalValue._28_8_ = 0;
            local_138.NDCFromWorld.optionalValue._36_8_ = 0;
            local_138.NDCFromWorld.optionalValue._44_8_ = 0;
            local_138.renderTimeSeconds.optionalValue =
                 (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
            local_138.renderTimeSeconds.set = false;
            local_138.renderTimeSeconds._5_3_ = 0;
            local_138.cameraFromWorld.optionalValue._0_8_ = 0;
            local_138.cameraFromWorld.optionalValue._8_8_ = 0;
            local_138.cameraFromWorld.optionalValue._16_8_ = 0;
            local_138.cameraFromWorld.optionalValue._24_8_ = 0;
            local_138.cameraFromWorld.optionalValue._32_8_ = 0;
            local_138.cameraFromWorld.optionalValue._40_8_ = 0;
            local_138.cameraFromWorld.optionalValue._48_8_ = 0;
            local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            bVar3 = pbrt::Image::Write((Image *)&local_270,&local_2f8,&local_138);
            if (!bVar3) {
              pbrt::LogFatal<char_const(&)[24]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                         ,0x28a,"Check failed: %s",(char (*) [24])"avgImage.Write(avgFile)");
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&local_138.stringVectors._M_t);
            local_160 = 0;
            (*(*(_func_int ***)local_178._0_8_)[3])
                      (local_178._0_8_,local_178._8_8_,sStack_168 << 2,4);
            local_180 = 0;
            (*(*(_func_int ***)local_198._0_8_)[3])
                      (local_198._0_8_,local_198._8_8_,sStack_188 * 2,2);
            local_1a0 = 0;
            (*(*(_func_int ***)local_1b8._0_8_)[3])(local_1b8._0_8_,local_1b8._8_8_,sStack_1a8,1);
            pbrt::
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_260);
            iVar4 = 0;
          }
          std::vector<pbrt::Image,_std::allocator<pbrt::Image>_>::~vector(&local_288);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,
                          CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                                   local_318.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,
                          CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                   local_2f8.field_2._M_local_buf[0]) + 1);
        }
        return iVar4;
      }
      local_328 = "must provide --outfile.";
    }
  }
  usage("average",local_328);
}

Assistant:

int average(int argc, char *argv[]) {
    std::string avgFile, filenameBase;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("average", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &avgFile, onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("average", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("average", "must provide base filename.");
    if (avgFile.empty())
        usage("average", "must provide --outfile.");

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    // Compute average image
    std::vector<Image> avgImages(MaxThreadIndex());
    std::atomic<bool> failed{false};

    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;

        Image &avg = avgImages[ThreadIndex];
        if (avg.Resolution() == Point2i(0, 0))
            avg = Image(PixelFormat::Float, im.Resolution(), im.ChannelNames());
        else if (!checkImageCompatibility(filenames[i], im, filenames[0], avg)) {
            failed = true;
            return;
        }

        for (int y = 0; y < avg.Resolution().y; ++y)
            for (int x = 0; x < avg.Resolution().x; ++x)
                for (int c = 0; c < avg.NChannels(); ++c) {
                    Float v = im.GetChannel({x, y}, c) / filenames.size();
                    if (std::isnan(v))
                        LOG_FATAL("NAN Pixel at %s in %s", Point2f(x, y), filenames[i]);
                    if (std::isinf(v))
                        v = 0;
                    avg.SetChannel({x, y}, c, avg.GetChannel({x, y}, c) + v);
                }
    });

    if (failed)
        return 1;

    // Average per-thread average images
    Image avgImage;
    for (const Image &im : avgImages) {
        if (im.Resolution() == Point2i(0, 0))
            continue;
        else if (avgImage.Resolution() == Point2i(0, 0)) {
            // First valid one
            avgImage = im;
        } else {
            for (int y = 0; y < avgImage.Resolution().y; ++y)
                for (int x = 0; x < avgImage.Resolution().x; ++x)
                    for (int c = 0; c < avgImage.NChannels(); ++c) {
                        Float v = im.GetChannel({x, y}, c);
                        if (!std::isinf(v))
                            avgImage.SetChannel({x, y}, c,
                                                avgImage.GetChannel({x, y}, c) + v);
                    }
        }
    }

    CHECK(avgImage.Write(avgFile));

    return 0;
}